

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O2

void __thiscall AGSSock::Pool::Pool(Pool *this)

{
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  (this->sockets_)._M_h._M_buckets = &(this->sockets_)._M_h._M_single_bucket;
  (this->sockets_)._M_h._M_bucket_count = 1;
  (this->sockets_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sockets_)._M_h._M_element_count = 0;
  (this->sockets_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sockets_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sockets_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  AGSSockAPI::Mutex::Mutex(&this->guard_);
  AGSSockAPI::Beacon::Beacon(&this->beacon_);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/FTPlus[P]AGSsock/src/Pool.h:48:19)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/FTPlus[P]AGSsock/src/Pool.h:48:19)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  AGSSockAPI::Thread::Thread(&this->thread_,(Callback *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return;
}

Assistant:

Pool() : thread_([this]() { run(); }) {}